

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMNontrappingFPToIntLowering.cpp
# Opt level: O0

void __thiscall
wasm::LLVMNonTrappingFPToIntLowering::~LLVMNonTrappingFPToIntLowering
          (LLVMNonTrappingFPToIntLowering *this)

{
  LLVMNonTrappingFPToIntLowering *this_local;
  
  Pass::~Pass(&this->super_Pass);
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasTruncSat()) {
      return;
    }
    PassRunner runner(module);
    // Run the Impl pass as an inner pass in parallel. This pass updates the
    // module features, so it can't be parallel.
    runner.add(std::make_unique<LLVMNonTrappingFPToIntLoweringImpl>());
    runner.setIsNested(true);
    runner.run();
    module->features.disable(FeatureSet::TruncSat);
  }